

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPToken cp_next(CPState *cp)

{
  CPToken CVar1;
  long in_RDI;
  
  CVar1 = cp_next_(cp);
  *(CPToken *)(in_RDI + 4) = CVar1;
  return CVar1;
}

Assistant:

static LJ_NOINLINE CPToken cp_next(CPState *cp)
{
  return (cp->tok = cp_next_(cp));
}